

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_64x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  undefined1 auVar9 [16];
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  __m128i round;
  __m128i scaled_top_right8;
  __m128i scaled_top_right7;
  __m128i scaled_top_right6;
  __m128i scaled_top_right5;
  __m128i inverted_weights8;
  __m128i inverted_weights7;
  __m128i inverted_weights6;
  __m128i inverted_weights5;
  __m128i weights8;
  __m128i weights7;
  __m128i weights6;
  __m128i weights5;
  __m128i weights_hihi;
  __m128i weights_hilo;
  __m128i scaled_top_right4;
  __m128i scaled_top_right3;
  __m128i scaled_top_right2;
  __m128i scaled_top_right1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i scale;
  __m128i weights_lohi;
  __m128i weights_lolo;
  __m128i top_right;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_108c;
  int local_106c;
  undefined8 *local_e58;
  byte local_df8;
  undefined1 uStack_df7;
  undefined1 uStack_df6;
  undefined1 uStack_df5;
  byte bStack_df4;
  undefined1 uStack_df3;
  undefined1 uStack_df2;
  undefined1 uStack_df1;
  ushort uStack_ae2;
  ushort uStack_ada;
  ushort uStack_ac2;
  ushort uStack_aba;
  ushort uStack_aa2;
  ushort uStack_a9a;
  ushort uStack_a82;
  ushort uStack_a7a;
  ushort uStack_a62;
  ushort uStack_a5a;
  ushort uStack_a42;
  ushort uStack_a3a;
  ushort uStack_a22;
  ushort uStack_a1a;
  ushort uStack_a06;
  ushort uStack_a04;
  ushort uStack_a02;
  ushort uStack_9fe;
  ushort uStack_9fc;
  ushort uStack_9fa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i left;
  int left_offset;
  
  bVar2 = *(byte *)(in_RDX + 0x3f);
  uVar4 = (ushort)bVar2;
  uStack_a06 = (ushort)bVar2;
  uStack_a04 = (ushort)bVar2;
  uStack_a02 = (ushort)bVar2;
  uStack_9fe = (ushort)bVar2;
  uStack_9fc = (ushort)bVar2;
  uStack_9fa = (ushort)bVar2;
  uStack_a22 = (ushort)bVar2;
  uStack_a1a = (ushort)bVar2;
  uStack_a42 = (ushort)bVar2;
  uStack_a3a = (ushort)bVar2;
  uStack_a62 = (ushort)bVar2;
  uStack_a5a = (ushort)bVar2;
  uStack_a82 = (ushort)bVar2;
  uStack_a7a = (ushort)bVar2;
  uStack_aa2 = (ushort)bVar2;
  uStack_a9a = (ushort)bVar2;
  uStack_ac2 = (ushort)bVar2;
  uStack_aba = (ushort)bVar2;
  uStack_ae2 = (ushort)bVar2;
  uStack_ada = (ushort)bVar2;
  local_e58 = in_RDI;
  for (local_106c = 0; local_106c < 0x40; local_106c = local_106c + 8) {
    uVar1 = *(undefined8 *)(in_RCX + local_106c);
    local_df8 = (byte)uVar1;
    uStack_df7 = (undefined1)((ulong)uVar1 >> 8);
    uStack_df6 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_df5 = (undefined1)((ulong)uVar1 >> 0x18);
    bStack_df4 = (byte)((ulong)uVar1 >> 0x20);
    uStack_df3 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_df2 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_df1 = (undefined1)((ulong)uVar1 >> 0x38);
    for (local_108c = 0x1000100; local_108c < 0xf0e0f0f; local_108c = local_108c + 0x2020202) {
      auVar9._4_4_ = local_108c;
      auVar9._0_4_ = local_108c;
      auVar9._12_4_ = local_108c;
      auVar9._8_4_ = local_108c;
      auVar3[1] = 0;
      auVar3[0] = local_df8;
      auVar3[2] = uStack_df7;
      auVar3[3] = 0;
      auVar3[4] = uStack_df6;
      auVar3[5] = 0;
      auVar3[6] = uStack_df5;
      auVar3[7] = 0;
      auVar3[9] = 0;
      auVar3[8] = bStack_df4;
      auVar3[10] = uStack_df3;
      auVar3[0xb] = 0;
      auVar3[0xc] = uStack_df2;
      auVar3[0xd] = 0;
      auVar3[0xe] = uStack_df1;
      auVar3[0xf] = 0;
      auVar9 = pshufb(auVar3,auVar9);
      local_2a8 = auVar9._0_2_;
      sStack_2a6 = auVar9._2_2_;
      sStack_2a4 = auVar9._4_2_;
      sStack_2a2 = auVar9._6_2_;
      sStack_2a0 = auVar9._8_2_;
      sStack_29e = auVar9._10_2_;
      sStack_29c = auVar9._12_2_;
      sStack_29a = auVar9._14_2_;
      uVar5 = uVar4 + local_2a8 * 0xff + 0x80;
      uVar10 = uStack_a06 * 8 + sStack_2a6 * 0xf8 + 0x80;
      uVar14 = uStack_a04 * 0x10 + sStack_2a4 * 0xf0 + 0x80;
      uVar18 = uStack_a02 * 0x17 + sStack_2a2 * 0xe9 + 0x80;
      uVar22 = uVar4 * 0x1f + sStack_2a0 * 0xe1 + 0x80;
      uVar26 = uStack_9fe * 0x26 + sStack_29e * 0xda + 0x80;
      uVar30 = uStack_9fc * 0x2e + sStack_29c * 0xd2 + 0x80;
      uVar34 = uStack_9fa * 0x35 + sStack_29a * 0xcb + 0x80;
      uVar6 = uVar5 >> 8;
      uVar11 = uVar10 >> 8;
      uVar15 = uVar14 >> 8;
      uVar19 = uVar18 >> 8;
      uVar23 = uVar22 >> 8;
      uVar27 = uVar26 >> 8;
      uVar31 = uVar30 >> 8;
      uVar35 = uVar34 >> 8;
      uVar7 = uVar4 * 0x3c + local_2a8 * 0xc4 + 0x80;
      uVar12 = uStack_a06 * 0x43 + sStack_2a6 * 0xbd + 0x80;
      uVar16 = uStack_a04 * 0x4a + sStack_2a4 * 0xb6 + 0x80;
      uVar20 = uStack_a22 * 0x50 + sStack_2a2 * 0xb0 + 0x80;
      uVar24 = uVar4 * 0x57 + sStack_2a0 * 0xa9 + 0x80;
      uVar28 = uStack_9fe * 0x5d + sStack_29e * 0xa3 + 0x80;
      uVar32 = uStack_9fc * 100 + sStack_29c * 0x9c + 0x80;
      uVar36 = uStack_a1a * 0x6a + sStack_29a * 0x96 + 0x80;
      uVar8 = uVar7 >> 8;
      uVar13 = uVar12 >> 8;
      uVar17 = uVar16 >> 8;
      uVar21 = uVar20 >> 8;
      uVar25 = uVar24 >> 8;
      uVar29 = uVar28 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      *local_e58 = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35)
                            ,CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                      (0xff < uVar31),
                                      CONCAT15((uVar27 != 0) * (uVar27 < 0x100) *
                                               (char)(uVar26 >> 8) - (0xff < uVar27),
                                               CONCAT14((uVar23 != 0) * (uVar23 < 0x100) *
                                                        (char)(uVar22 >> 8) - (0xff < uVar23),
                                                        CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                                 (char)(uVar18 >> 8) -
                                                                 (0xff < uVar19),
                                                                 CONCAT12((uVar15 != 0) *
                                                                          (uVar15 < 0x100) *
                                                                          (char)(uVar14 >> 8) -
                                                                          (0xff < uVar15),
                                                                          CONCAT11((uVar11 != 0) *
                                                                                   (uVar11 < 0x100)
                                                                                   * (char)(uVar10 
                                                  >> 8) - (0xff < uVar11),
                                                  (uVar6 != 0) * (uVar6 < 0x100) *
                                                  (char)(uVar5 >> 8) - (0xff < uVar6))))))));
      local_e58[1] = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                              (0xff < uVar37),
                              CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                       (0xff < uVar33),
                                       CONCAT15((uVar29 != 0) * (uVar29 < 0x100) *
                                                (char)(uVar28 >> 8) - (0xff < uVar29),
                                                CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                         (char)(uVar24 >> 8) - (0xff < uVar25),
                                                         CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                                  (char)(uVar20 >> 8) -
                                                                  (0xff < uVar21),
                                                                  CONCAT12((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           CONCAT11((uVar13 != 0) *
                                                                                    (uVar13 < 0x100)
                                                                                    * (char)(uVar12 
                                                  >> 8) - (0xff < uVar13),
                                                  (uVar8 != 0) * (uVar8 < 0x100) *
                                                  (char)(uVar7 >> 8) - (0xff < uVar8))))))));
      uVar5 = uVar4 * 0x70 + local_2a8 * 0x90 + 0x80;
      uVar10 = uStack_a06 * 0x76 + sStack_2a6 * 0x8a + 0x80;
      uVar14 = uStack_a04 * 0x7b + sStack_2a4 * 0x85 + 0x80;
      uVar18 = uStack_a42 * 0x81 + sStack_2a2 * 0x7f + 0x80;
      uVar22 = uVar4 * 0x87 + sStack_2a0 * 0x79 + 0x80;
      uVar26 = uStack_9fe * 0x8c + sStack_29e * 0x74 + 0x80;
      uVar30 = uStack_9fc * 0x91 + sStack_29c * 0x6f + 0x80;
      uVar34 = uStack_a3a * 0x96 + sStack_29a * 0x6a + 0x80;
      uVar6 = uVar5 >> 8;
      uVar11 = uVar10 >> 8;
      uVar15 = uVar14 >> 8;
      uVar19 = uVar18 >> 8;
      uVar23 = uVar22 >> 8;
      uVar27 = uVar26 >> 8;
      uVar31 = uVar30 >> 8;
      uVar35 = uVar34 >> 8;
      uVar7 = uVar4 * 0x9b + local_2a8 * 0x65 + 0x80;
      uVar12 = uStack_a06 * 0xa0 + sStack_2a6 * 0x60 + 0x80;
      uVar16 = uStack_a04 * 0xa5 + sStack_2a4 * 0x5b + 0x80;
      uVar20 = uStack_a62 * 0xaa + sStack_2a2 * 0x56 + 0x80;
      uVar24 = uVar4 * 0xae + sStack_2a0 * 0x52 + 0x80;
      uVar28 = uStack_9fe * 0xb3 + sStack_29e * 0x4d + 0x80;
      uVar32 = uStack_9fc * 0xb7 + sStack_29c * 0x49 + 0x80;
      uVar36 = uStack_a5a * 0xbb + sStack_29a * 0x45 + 0x80;
      uVar8 = uVar7 >> 8;
      uVar13 = uVar12 >> 8;
      uVar17 = uVar16 >> 8;
      uVar21 = uVar20 >> 8;
      uVar25 = uVar24 >> 8;
      uVar29 = uVar28 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      local_e58[2] = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                              (0xff < uVar35),
                              CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                       (0xff < uVar31),
                                       CONCAT15((uVar27 != 0) * (uVar27 < 0x100) *
                                                (char)(uVar26 >> 8) - (0xff < uVar27),
                                                CONCAT14((uVar23 != 0) * (uVar23 < 0x100) *
                                                         (char)(uVar22 >> 8) - (0xff < uVar23),
                                                         CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                                  (char)(uVar18 >> 8) -
                                                                  (0xff < uVar19),
                                                                  CONCAT12((uVar15 != 0) *
                                                                           (uVar15 < 0x100) *
                                                                           (char)(uVar14 >> 8) -
                                                                           (0xff < uVar15),
                                                                           CONCAT11((uVar11 != 0) *
                                                                                    (uVar11 < 0x100)
                                                                                    * (char)(uVar10 
                                                  >> 8) - (0xff < uVar11),
                                                  (uVar6 != 0) * (uVar6 < 0x100) *
                                                  (char)(uVar5 >> 8) - (0xff < uVar6))))))));
      local_e58[3] = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                              (0xff < uVar37),
                              CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                       (0xff < uVar33),
                                       CONCAT15((uVar29 != 0) * (uVar29 < 0x100) *
                                                (char)(uVar28 >> 8) - (0xff < uVar29),
                                                CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                         (char)(uVar24 >> 8) - (0xff < uVar25),
                                                         CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                                  (char)(uVar20 >> 8) -
                                                                  (0xff < uVar21),
                                                                  CONCAT12((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           CONCAT11((uVar13 != 0) *
                                                                                    (uVar13 < 0x100)
                                                                                    * (char)(uVar12 
                                                  >> 8) - (0xff < uVar13),
                                                  (uVar8 != 0) * (uVar8 < 0x100) *
                                                  (char)(uVar7 >> 8) - (0xff < uVar8))))))));
      uVar5 = uVar4 * 0xbf + local_2a8 * 0x41 + 0x80;
      uVar10 = uStack_a06 * 0xc3 + sStack_2a6 * 0x3d + 0x80;
      uVar14 = uStack_a04 * 199 + sStack_2a4 * 0x39 + 0x80;
      uVar18 = uStack_a82 * 0xca + sStack_2a2 * 0x36 + 0x80;
      uVar22 = uVar4 * 0xce + sStack_2a0 * 0x32 + 0x80;
      uVar26 = uStack_9fe * 0xd1 + sStack_29e * 0x2f + 0x80;
      uVar30 = uStack_9fc * 0xd4 + sStack_29c * 0x2c + 0x80;
      uVar34 = uStack_a7a * 0xd7 + sStack_29a * 0x29 + 0x80;
      uVar6 = uVar5 >> 8;
      uVar11 = uVar10 >> 8;
      uVar15 = uVar14 >> 8;
      uVar19 = uVar18 >> 8;
      uVar23 = uVar22 >> 8;
      uVar27 = uVar26 >> 8;
      uVar31 = uVar30 >> 8;
      uVar35 = uVar34 >> 8;
      uVar7 = uVar4 * 0xda + local_2a8 * 0x26 + 0x80;
      uVar12 = uStack_a06 * 0xdd + sStack_2a6 * 0x23 + 0x80;
      uVar16 = uStack_a04 * 0xe0 + sStack_2a4 * 0x20 + 0x80;
      uVar20 = uStack_aa2 * 0xe3 + sStack_2a2 * 0x1d + 0x80;
      uVar24 = uVar4 * 0xe5 + sStack_2a0 * 0x1b + 0x80;
      uVar28 = uStack_9fe * 0xe7 + sStack_29e * 0x19 + 0x80;
      uVar32 = uStack_9fc * 0xea + sStack_29c * 0x16 + 0x80;
      uVar36 = uStack_a9a * 0xec + sStack_29a * 0x14 + 0x80;
      uVar8 = uVar7 >> 8;
      uVar13 = uVar12 >> 8;
      uVar17 = uVar16 >> 8;
      uVar21 = uVar20 >> 8;
      uVar25 = uVar24 >> 8;
      uVar29 = uVar28 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      local_e58[4] = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                              (0xff < uVar35),
                              CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                       (0xff < uVar31),
                                       CONCAT15((uVar27 != 0) * (uVar27 < 0x100) *
                                                (char)(uVar26 >> 8) - (0xff < uVar27),
                                                CONCAT14((uVar23 != 0) * (uVar23 < 0x100) *
                                                         (char)(uVar22 >> 8) - (0xff < uVar23),
                                                         CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                                  (char)(uVar18 >> 8) -
                                                                  (0xff < uVar19),
                                                                  CONCAT12((uVar15 != 0) *
                                                                           (uVar15 < 0x100) *
                                                                           (char)(uVar14 >> 8) -
                                                                           (0xff < uVar15),
                                                                           CONCAT11((uVar11 != 0) *
                                                                                    (uVar11 < 0x100)
                                                                                    * (char)(uVar10 
                                                  >> 8) - (0xff < uVar11),
                                                  (uVar6 != 0) * (uVar6 < 0x100) *
                                                  (char)(uVar5 >> 8) - (0xff < uVar6))))))));
      local_e58[5] = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                              (0xff < uVar37),
                              CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                       (0xff < uVar33),
                                       CONCAT15((uVar29 != 0) * (uVar29 < 0x100) *
                                                (char)(uVar28 >> 8) - (0xff < uVar29),
                                                CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                         (char)(uVar24 >> 8) - (0xff < uVar25),
                                                         CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                                  (char)(uVar20 >> 8) -
                                                                  (0xff < uVar21),
                                                                  CONCAT12((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           CONCAT11((uVar13 != 0) *
                                                                                    (uVar13 < 0x100)
                                                                                    * (char)(uVar12 
                                                  >> 8) - (0xff < uVar13),
                                                  (uVar8 != 0) * (uVar8 < 0x100) *
                                                  (char)(uVar7 >> 8) - (0xff < uVar8))))))));
      uVar5 = uVar4 * 0xee + local_2a8 * 0x12 + 0x80;
      uVar10 = uStack_a06 * 0xf0 + sStack_2a6 * 0x10 + 0x80;
      uVar14 = uStack_a04 * 0xf1 + sStack_2a4 * 0xf + 0x80;
      uVar18 = uStack_ac2 * 0xf3 + sStack_2a2 * 0xd + 0x80;
      uVar22 = uVar4 * 0xf4 + sStack_2a0 * 0xc + 0x80;
      uVar26 = uStack_9fe * 0xf6 + sStack_29e * 10 + 0x80;
      uVar30 = uStack_9fc * 0xf7 + sStack_29c * 9 + 0x80;
      uVar34 = uStack_aba * 0xf8 + sStack_29a * 8 + 0x80;
      uVar6 = uVar5 >> 8;
      uVar11 = uVar10 >> 8;
      uVar15 = uVar14 >> 8;
      uVar19 = uVar18 >> 8;
      uVar23 = uVar22 >> 8;
      uVar27 = uVar26 >> 8;
      uVar31 = uVar30 >> 8;
      uVar35 = uVar34 >> 8;
      uVar7 = uVar4 * 0xf9 + local_2a8 * 7 + 0x80;
      uVar12 = uStack_a06 * 0xfa + sStack_2a6 * 6 + 0x80;
      uVar16 = uStack_a04 * 0xfa + sStack_2a4 * 6 + 0x80;
      uVar20 = uStack_ae2 * 0xfb + sStack_2a2 * 5 + 0x80;
      uVar24 = uVar4 * 0xfb + sStack_2a0 * 5 + 0x80;
      uVar28 = uStack_9fe * 0xfc + sStack_29e * 4 + 0x80;
      uVar32 = uStack_9fc * 0xfc + sStack_29c * 4 + 0x80;
      uVar36 = uStack_ada * 0xfc + sStack_29a * 4 + 0x80;
      uVar8 = uVar7 >> 8;
      uVar13 = uVar12 >> 8;
      uVar17 = uVar16 >> 8;
      uVar21 = uVar20 >> 8;
      uVar25 = uVar24 >> 8;
      uVar29 = uVar28 >> 8;
      uVar33 = uVar32 >> 8;
      uVar37 = uVar36 >> 8;
      local_e58[6] = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                              (0xff < uVar35),
                              CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                       (0xff < uVar31),
                                       CONCAT15((uVar27 != 0) * (uVar27 < 0x100) *
                                                (char)(uVar26 >> 8) - (0xff < uVar27),
                                                CONCAT14((uVar23 != 0) * (uVar23 < 0x100) *
                                                         (char)(uVar22 >> 8) - (0xff < uVar23),
                                                         CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                                  (char)(uVar18 >> 8) -
                                                                  (0xff < uVar19),
                                                                  CONCAT12((uVar15 != 0) *
                                                                           (uVar15 < 0x100) *
                                                                           (char)(uVar14 >> 8) -
                                                                           (0xff < uVar15),
                                                                           CONCAT11((uVar11 != 0) *
                                                                                    (uVar11 < 0x100)
                                                                                    * (char)(uVar10 
                                                  >> 8) - (0xff < uVar11),
                                                  (uVar6 != 0) * (uVar6 < 0x100) *
                                                  (char)(uVar5 >> 8) - (0xff < uVar6))))))));
      local_e58[7] = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                              (0xff < uVar37),
                              CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                       (0xff < uVar33),
                                       CONCAT15((uVar29 != 0) * (uVar29 < 0x100) *
                                                (char)(uVar28 >> 8) - (0xff < uVar29),
                                                CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                         (char)(uVar24 >> 8) - (0xff < uVar25),
                                                         CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                                  (char)(uVar20 >> 8) -
                                                                  (0xff < uVar21),
                                                                  CONCAT12((uVar17 != 0) *
                                                                           (uVar17 < 0x100) *
                                                                           (char)(uVar16 >> 8) -
                                                                           (0xff < uVar17),
                                                                           CONCAT11((uVar13 != 0) *
                                                                                    (uVar13 < 0x100)
                                                                                    * (char)(uVar12 
                                                  >> 8) - (0xff < uVar13),
                                                  (uVar8 != 0) * (uVar8 < 0x100) *
                                                  (char)(uVar7 >> 8) - (0xff < uVar8))))))));
      local_e58 = (undefined8 *)(in_RSI + (long)local_e58);
    }
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_64x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[63]);
  const __m128i weights_lolo = LoadUnaligned16(smooth_weights + 60);
  const __m128i weights_lohi = LoadUnaligned16(smooth_weights + 76);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lolo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lolo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_lohi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_lohi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i weights_hilo = LoadUnaligned16(smooth_weights + 92);
  const __m128i weights_hihi = LoadUnaligned16(smooth_weights + 108);
  const __m128i weights5 = cvtepu8_epi16(weights_hilo);
  const __m128i weights6 = cvtepu8_epi16(_mm_srli_si128(weights_hilo, 8));
  const __m128i weights7 = cvtepu8_epi16(weights_hihi);
  const __m128i weights8 = cvtepu8_epi16(_mm_srli_si128(weights_hihi, 8));
  const __m128i inverted_weights5 = _mm_sub_epi16(scale, weights5);
  const __m128i inverted_weights6 = _mm_sub_epi16(scale, weights6);
  const __m128i inverted_weights7 = _mm_sub_epi16(scale, weights7);
  const __m128i inverted_weights8 = _mm_sub_epi16(scale, weights8);
  const __m128i scaled_top_right5 =
      _mm_mullo_epi16(inverted_weights5, top_right);
  const __m128i scaled_top_right6 =
      _mm_mullo_epi16(inverted_weights6, top_right);
  const __m128i scaled_top_right7 =
      _mm_mullo_epi16(inverted_weights7, top_right);
  const __m128i scaled_top_right8 =
      _mm_mullo_epi16(inverted_weights8, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int left_offset = 0; left_offset < 64; left_offset += 8) {
    const __m128i left = cvtepu8_epi16(LoadLo8(left_column + left_offset));
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i left_y = _mm_shuffle_epi8(left, y_select);
      write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                     scaled_top_right1, scaled_top_right2,
                                     round);
      write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3,
                                     weights4, scaled_top_right3,
                                     scaled_top_right4, round);
      write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5,
                                     weights6, scaled_top_right5,
                                     scaled_top_right6, round);
      write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7,
                                     weights8, scaled_top_right7,
                                     scaled_top_right8, round);
      dst += stride;
    }
  }
}